

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::set_execution_mode
          (Compiler *this,ExecutionMode mode,uint32_t arg0,uint32_t arg1,uint32_t arg2)

{
  SPIREntryPoint *pSVar1;
  
  pSVar1 = get_entry_point(this);
  Bitset::set(&pSVar1->flags,mode);
  if (mode == ExecutionModeInvocations) {
    pSVar1->invocations = arg0;
  }
  else if (mode == ExecutionModeOutputPrimitivesEXT) {
    pSVar1->output_primitives = arg0;
  }
  else if (mode == ExecutionModeOutputVertices) {
    pSVar1->output_vertices = arg0;
  }
  else if (mode == ExecutionModeLocalSizeId) {
    (pSVar1->workgroup_size).id_x = arg0;
    (pSVar1->workgroup_size).id_y = arg1;
    (pSVar1->workgroup_size).id_z = arg2;
  }
  else if (mode == ExecutionModeLocalSize) {
    (pSVar1->workgroup_size).x = arg0;
    (pSVar1->workgroup_size).y = arg1;
    (pSVar1->workgroup_size).z = arg2;
  }
  return;
}

Assistant:

void Compiler::set_execution_mode(ExecutionMode mode, uint32_t arg0, uint32_t arg1, uint32_t arg2)
{
	auto &execution = get_entry_point();

	execution.flags.set(mode);
	switch (mode)
	{
	case ExecutionModeLocalSize:
		execution.workgroup_size.x = arg0;
		execution.workgroup_size.y = arg1;
		execution.workgroup_size.z = arg2;
		break;

	case ExecutionModeLocalSizeId:
		execution.workgroup_size.id_x = arg0;
		execution.workgroup_size.id_y = arg1;
		execution.workgroup_size.id_z = arg2;
		break;

	case ExecutionModeInvocations:
		execution.invocations = arg0;
		break;

	case ExecutionModeOutputVertices:
		execution.output_vertices = arg0;
		break;

	case ExecutionModeOutputPrimitivesEXT:
		execution.output_primitives = arg0;
		break;

	default:
		break;
	}
}